

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.hpp
# Opt level: O0

void __thiscall options2::options2(options2 *this,uint argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  options2 *in_RDX;
  uint in_ESI;
  undefined1 *in_RDI;
  uint i;
  char *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  bool local_17a;
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [37];
  byte local_a3;
  byte local_a2;
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [36];
  uint local_54;
  string local_50 [35];
  allocator local_2d [13];
  char *in_stack_ffffffffffffffe0;
  
  *in_RDI = 1;
  *(undefined4 *)(in_RDI + 4) = 0xf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 8),"1",(allocator *)&stack0xffffffffffffffe7);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x28),"1",local_2d);
  std::allocator<char>::~allocator((allocator<char> *)local_2d);
  std::__cxx11::string::string((string *)(in_RDI + 0x48));
  std::__cxx11::string::string((string *)(in_RDI + 0x68));
  std::__cxx11::string::string((string *)(in_RDI + 0x88));
  if (in_ESI == 1) {
    help_abi_cxx11_(in_RDX,in_stack_ffffffffffffffe0);
    std::operator<<((ostream *)&std::cerr,local_50);
    std::__cxx11::string::~string(local_50);
  }
  else {
    for (local_54 = 1; local_54 < in_ESI; local_54 = local_54 + 1) {
      pcVar1 = *(char **)(&in_RDX->valid + (ulong)local_54 * 8);
      std::allocator<char>::allocator();
      local_a2 = 0;
      local_a3 = 0;
      std::__cxx11::string::string(local_78,pcVar1,&local_79);
      bVar2 = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      local_17a = true;
      if (!bVar2) {
        pcVar1 = *(char **)(&in_RDX->valid + (ulong)local_54 * 8);
        std::allocator<char>::allocator();
        local_a2 = 1;
        std::__cxx11::string::string(local_a0,pcVar1,&local_a1);
        local_a3 = 1;
        local_17a = std::operator==(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      }
      if ((local_a3 & 1) != 0) {
        std::__cxx11::string::~string(local_a0);
      }
      if ((local_a2 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      }
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      if (local_17a != false) {
        help_abi_cxx11_(in_RDX,in_stack_ffffffffffffffe0);
        std::operator<<((ostream *)&std::cerr,local_c8);
        std::__cxx11::string::~string(local_c8);
        return;
      }
      if (**(char **)(&in_RDX->valid + (ulong)local_54 * 8) != '-') {
        switch(~local_54 + in_ESI) {
        case 0:
          psVar4 = (string *)std::__cxx11::string::operator=((string *)(in_RDI + 0x28),"1");
          std::__cxx11::string::operator=((string *)(in_RDI + 8),psVar4);
          psVar4 = (string *)
                   std::__cxx11::string::operator=
                             ((string *)(in_RDI + 0x88),
                              *(char **)(&in_RDX->valid + (ulong)local_54 * 8));
          psVar4 = (string *)std::__cxx11::string::operator=((string *)(in_RDI + 0x68),psVar4);
          std::__cxx11::string::operator=((string *)(in_RDI + 0x48),psVar4);
          return;
        case 1:
          psVar4 = (string *)
                   std::__cxx11::string::operator=
                             ((string *)(in_RDI + 0x28),
                              *(char **)(&in_RDX->valid + (ulong)local_54 * 8));
          std::__cxx11::string::operator=((string *)(in_RDI + 8),psVar4);
          psVar4 = (string *)
                   std::__cxx11::string::operator=
                             ((string *)(in_RDI + 0x88),
                              *(char **)(&in_RDX->valid + (ulong)(local_54 + 1) * 8));
          psVar4 = (string *)std::__cxx11::string::operator=((string *)(in_RDI + 0x68),psVar4);
          std::__cxx11::string::operator=((string *)(in_RDI + 0x48),psVar4);
          return;
        case 2:
          std::__cxx11::string::operator=
                    ((string *)(in_RDI + 8),*(char **)(&in_RDX->valid + (ulong)local_54 * 8));
          std::__cxx11::string::operator=
                    ((string *)(in_RDI + 0x28),
                     *(char **)(&in_RDX->valid + (ulong)(local_54 + 1) * 8));
          psVar4 = (string *)
                   std::__cxx11::string::operator=
                             ((string *)(in_RDI + 0x88),
                              *(char **)(&in_RDX->valid + (ulong)(local_54 + 2) * 8));
          psVar4 = (string *)std::__cxx11::string::operator=((string *)(in_RDI + 0x68),psVar4);
          std::__cxx11::string::operator=((string *)(in_RDI + 0x48),psVar4);
          return;
        default:
          help_abi_cxx11_(in_RDX,in_stack_ffffffffffffffe0);
          std::operator<<((ostream *)&std::cerr,local_128);
          std::__cxx11::string::~string(local_128);
          return;
        case 4:
          std::__cxx11::string::operator=
                    ((string *)(in_RDI + 8),*(char **)(&in_RDX->valid + (ulong)local_54 * 8));
          std::__cxx11::string::operator=
                    ((string *)(in_RDI + 0x28),
                     *(char **)(&in_RDX->valid + (ulong)(local_54 + 1) * 8));
          std::__cxx11::string::operator=
                    ((string *)(in_RDI + 0x48),
                     *(char **)(&in_RDX->valid + (ulong)(local_54 + 2) * 8));
          std::__cxx11::string::operator=
                    ((string *)(in_RDI + 0x68),
                     *(char **)(&in_RDX->valid + (ulong)(local_54 + 3) * 8));
          std::__cxx11::string::operator=
                    ((string *)(in_RDI + 0x88),
                     *(char **)(&in_RDX->valid + (ulong)(local_54 + 4) * 8));
          return;
        }
      }
      if (*(char *)(*(long *)(&in_RDX->valid + (ulong)local_54 * 8) + 1) != 'p') {
        help_abi_cxx11_(in_RDX,in_stack_ffffffffffffffe0);
        std::operator<<((ostream *)&std::cerr,local_108);
        std::__cxx11::string::~string(local_108);
        return;
      }
      local_54 = local_54 + 1;
      if (local_54 == in_ESI) {
        help_abi_cxx11_(in_RDX,in_stack_ffffffffffffffe0);
        std::operator<<((ostream *)&std::cerr,local_e8);
        std::__cxx11::string::~string(local_e8);
        return;
      }
      iVar3 = atoi(*(char **)(&in_RDX->valid + (ulong)local_54 * 8));
      *(int *)(in_RDI + 4) = iVar3;
    }
  }
  return;
}

Assistant:

options2(unsigned argc, char *argv[])
      : valid(true), prec(15), Jx("1"), Jy("1") {
    if (argc == 1) {
      std::cerr << help(argv[0]);
      return;
    }
    for (unsigned i = 1; i < argc; ++i) {
      if (std::string(argv[i]) == "-h" || std::string(argv[i]) == "--help") {
        std::cerr << help(argv[0]);
        return;
      }
      switch (argv[i][0]) {
        case '-':
          switch (argv[i][1]) {
            case 'p':
              if (++i == argc) {
                std::cerr << help(argv[0]);
                return;
              }
              prec = atoi(argv[i]);
              break;
            default:
              std::cerr << help(argv[0]);
              return;
          }
          break;
        default:
          switch (argc - i) {
            case 1:
              Jx = Jy = "1";
              Tmin = Tmax = dT = argv[i];
              return;
            case 2:
              Jx = Jy = argv[i];
              Tmin = Tmax = dT = argv[i + 1];
              return;
            case 3:
              Jx = argv[i];
              Jy = argv[i + 1];
              Tmin = Tmax = dT = argv[i + 2];
              return;
            case 5:
              Jx = argv[i];
              Jy = argv[i + 1];
              Tmin = argv[i + 2];
              Tmax = argv[i + 3];
              dT = argv[i + 4];
              return;
            default:
              std::cerr << help(argv[0]);
              return;
          }
      }
    }
  }